

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_CheckClass
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  MetaClass *this;
  VMValue *pVVar2;
  AActor *pAVar3;
  MetaClass *pMVar4;
  bool bVar5;
  bool local_53;
  bool local_50;
  int local_4c;
  bool match_superclass;
  int pick_pointer;
  MetaClass *checktype;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xff,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 1) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x100,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    bVar5 = false;
    if (((param->field_0).field_3.Type == '\x03') &&
       (bVar5 = true, (param->field_0).field_1.atag != 1)) {
      bVar5 = (param->field_0).field_1.a == (void *)0x0;
    }
    if (!bVar5) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x100,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pAVar3 = (AActor *)(param->field_0).field_1.a;
    local_50 = true;
    if (pAVar3 != (AActor *)0x0) {
      local_50 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    }
    if (local_50 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x100,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 2) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x101,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    bVar5 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar5 = true, param[1].field_0.field_1.atag != 1)) {
      bVar5 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar5) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x101,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    this = (MetaClass *)param[1].field_0.field_1.a;
    local_53 = true;
    if (this != (MetaClass *)0x0) {
      local_53 = PClass::IsDescendantOf((PClass *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_53 == false) {
      __assert_fail("checktype == NULL || checktype->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x101,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 3) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x102,
                      "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      local_4c = (pVVar2->field_0).i;
    }
    else {
      if (param[2].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x102,
                      "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      local_4c = param[2].field_0.i;
    }
    if (numparam < 4) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x103,
                      "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      iVar1 = (pVVar2->field_0).i;
    }
    else {
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x103,
                      "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = param[3].field_0.i;
    }
    pAVar3 = COPY_AAPTR(pAVar3,local_4c);
    if ((pAVar3 == (AActor *)0x0) || (this == (MetaClass *)0x0)) {
      VMReturn::SetInt(ret,0);
    }
    else if (iVar1 == 0) {
      pMVar4 = AActor::GetClass(pAVar3);
      VMReturn::SetInt(ret,(uint)(pMVar4 == this));
    }
    else {
      bVar5 = DObject::IsKindOf((DObject *)pAVar3,(PClass *)this);
      VMReturn::SetInt(ret,(uint)bVar5);
    }
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckClass)
{
	if (numret > 0)
	{
		assert(ret != NULL);
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS		(checktype, AActor);
		PARAM_INT_DEF	(pick_pointer);
		PARAM_BOOL_DEF	(match_superclass);

		self = COPY_AAPTR(self, pick_pointer);
		if (self == nullptr || checktype == nullptr)
		{
			ret->SetInt(false);
		}
		else if (match_superclass)
		{
			ret->SetInt(self->IsKindOf(checktype));
		}
		else
		{
			ret->SetInt(self->GetClass() == checktype);
		}
		return 1;
	}
	return 0;
}